

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

bool_t wwIsW_fast(word *a,size_t n,word w)

{
  bool bVar1;
  bool_t ret;
  word w_local;
  size_t n_local;
  word *a_local;
  
  if (n == 0) {
    ret = (bool_t)(w == 0);
  }
  else {
    bVar1 = *a == w;
    n_local = n;
    while( true ) {
      ret = (bool_t)bVar1;
      bVar1 = false;
      if (ret != 0) {
        n_local = n_local - 1;
        bVar1 = n_local != 0;
      }
      if (!bVar1) break;
      bVar1 = a[n_local] == 0;
    }
  }
  return ret;
}

Assistant:

bool_t FAST(wwIsW)(const word a[], size_t n, register word w)
{
	register bool_t ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = (w == 0);
	else
	{
		ret = (a[0] == w);
		while (ret && --n)
			ret = (a[n] == 0);
	}
	w = 0;
	return ret;
}